

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O3

bool __thiscall
Js::IndexPropertyDescriptorMap::TryGetLastIndex(IndexPropertyDescriptorMap *this,uint32 *lastIndex)

{
  uint uVar1;
  uint32 uVar2;
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int local_4c;
  uint32 *puStack_48;
  int i;
  IndexPropertyDescriptor *local_40;
  IndexPropertyDescriptor *descriptor;
  
  pBVar3 = (this->indexPropertyMap).ptr;
  if (pBVar3->count != pBVar3->freeCount) {
    EnsureIndexList(this);
    pBVar3 = (this->indexPropertyMap).ptr;
    iVar7 = pBVar3->count;
    uVar1 = pBVar3->freeCount;
    uVar8 = ~uVar1 + iVar7;
    if (-1 < (int)uVar8) {
      puStack_48 = lastIndex;
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      iVar7 = iVar7 - uVar1;
      uVar9 = (ulong)uVar8;
      do {
        uVar2 = (this->indexList).ptr[uVar9];
        descriptor._4_4_ = uVar2;
        bVar5 = JsUtil::
                BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::TryGetReference<unsigned_int>
                          ((this->indexPropertyMap).ptr,(uint *)((long)&descriptor + 4),&local_40,
                           &local_4c);
        if (!bVar5 || local_40 == (IndexPropertyDescriptor *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                      ,0x59,"(b && descriptor)","b && descriptor");
          if (!bVar5) {
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar6 = 0;
        }
        if ((local_40->Attributes & 8) == 0) {
          *puStack_48 = uVar2;
          return true;
        }
        iVar7 = iVar7 + -1;
        uVar9 = uVar9 - 1;
      } while (0 < iVar7);
    }
  }
  return false;
}

Assistant:

bool IndexPropertyDescriptorMap::TryGetLastIndex(uint32* lastIndex)
    {
        if (Count() == 0)
        {
            return false;
        }

        EnsureIndexList();

        // Search the index list backwards for the last index
        for (int i = Count() - 1; i >= 0; i--)
        {
            uint32 key = indexList[i];

            IndexPropertyDescriptor* descriptor;
            bool b = TryGetReference(key, &descriptor);
            Assert(b && descriptor);

            if (!(descriptor->Attributes & PropertyDeleted))
            {
                *lastIndex = key;
                return true;
            }
        }

        return false;
    }